

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O1

string * __thiscall ghc::net::uri::request_path_abi_cxx11_(string *__return_storage_ptr__,uri *this)

{
  stringstream result;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(this->_path)._M_dataplus._M_p,(this->_path)._M_string_length);
  if ((this->_query)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"?",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(this->_query)._M_dataplus._M_p,(this->_query)._M_string_length)
    ;
  }
  if ((this->_fragment)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"#",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(this->_fragment)._M_dataplus._M_p,
               (this->_fragment)._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE std::string uri::request_path() const
{
    std::stringstream result;
    result << _path;
    if (!_query.empty()) {
        result << "?" << _query;
    }
    if (!_fragment.empty()) {
        result << "#" << fragment();
    }
    return result.str();
}